

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subtype-exprs.h
# Opt level: O2

void __thiscall
wasm::SubtypingDiscoverer<NullFixer>::visitCallIndirect
          (SubtypingDiscoverer<NullFixer> *this,CallIndirect *curr)

{
  bool bVar1;
  Table *pTVar2;
  HeapType left;
  Signature sig;
  
  sig = HeapType::getSignature(&curr->heapType);
  handleCall<wasm::CallIndirect>(this,curr,sig);
  pTVar2 = Module::getTable(*(Module **)(this + 0xd0),(Name)(curr->table).super_IString.str);
  left = wasm::Type::getHeapType(&pTVar2->type);
  bVar1 = HeapType::isSubType(left,(HeapType)(curr->heapType).id);
  if (bVar1) {
    return;
  }
  HeapType::isSubType((HeapType)(curr->heapType).id,left);
  return;
}

Assistant:

void visitCallIndirect(CallIndirect* curr) {
    handleCall(curr, curr->heapType.getSignature());
    auto* table = self()->getModule()->getTable(curr->table);
    auto tableType = table->type.getHeapType();
    if (HeapType::isSubType(tableType, curr->heapType)) {
      // Unlike other casts, where cast targets are always subtypes of cast
      // sources, call_indirect target types may be supertypes of their source
      // table types. In this case, the cast will always succeed, but only if we
      // keep the types related.
      // TODO: No value flows here, so we could use |noteNonFlowSubtype|, but
      //       this is a trivial situation that is not worth optimizing.
      self()->noteSubtype(tableType, curr->heapType);
    } else if (HeapType::isSubType(curr->heapType, tableType)) {
      self()->noteCast(tableType, curr->heapType);
    } else {
      // The types are unrelated and the cast will fail. We can keep the types
      // unrelated.
    }
  }